

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall tinygltf::Buffer::operator==(Buffer *this,Buffer *other)

{
  bool bVar1;
  __type _Var2;
  Value *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  Value *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  Value *__rhs;
  
  __rhs = in_RDI;
  bVar1 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  local_11 = false;
  if (bVar1) {
    bVar1 = std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                             *)in_RDI,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                             *)in_stack_ffffffffffffffd8);
    local_11 = false;
    if (bVar1) {
      bVar1 = Value::operator==(in_RDI,in_stack_ffffffffffffffd8);
      local_11 = false;
      if (bVar1) {
        _Var2 = std::operator==(unaff_retaddr,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs);
        local_11 = false;
        if (_Var2) {
          local_11 = std::operator==(unaff_retaddr,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs);
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool Buffer::operator==(const Buffer &other) const {
  return this->data == other.data && this->extensions == other.extensions &&
         this->extras == other.extras && this->name == other.name &&
         this->uri == other.uri;
}